

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void compact_buffer(void)

{
  int iVar1;
  objc_static_instance_list *cat;
  objc_static_instance_list *c;
  undefined4 local_10;
  uint i;
  uint insert;
  uint size;
  
  iVar1 = buffered_objects;
  local_10 = 0;
  for (c._4_4_ = 0; c._4_4_ < (uint)iVar1; c._4_4_ = c._4_4_ + 1) {
    cat = buffered_object_at_index(c._4_4_);
    if (cat != (objc_static_instance_list *)0x0) {
      set_buffered_object_at_index(cat,local_10);
      local_10 = local_10 + 1;
    }
  }
  buffered_objects = local_10;
  return;
}

Assistant:

static void compact_buffer(void)
{
	// Move up all of the non-NULL pointers
	unsigned size = buffered_objects;
	unsigned insert = 0;
	for (unsigned i=0 ; i<size ; i++)
	{
		BUFFER_TYPE c = buffered_object_at_index(i);
		if (c != NULL)
		{
			set_buffered_object_at_index(c, insert++);
		}
	}
	buffered_objects = insert;
}